

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QByteArray,QPalette>::emplace<QPalette_const&>
          (QHash<QByteArray,QPalette> *this,QByteArray *key,QPalette *args)

{
  QPalettePrivate *pQVar1;
  Data<QHashPrivate::Node<QByteArray,_QPalette>_> *pDVar2;
  long in_FS_OFFSET;
  piter pVar3;
  QPalette local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QPalettePrivate **)this;
  if (pQVar1 == (QPalettePrivate *)0x0) {
LAB_002c43cc:
    pDVar2 = *(Data<QHashPrivate::Node<QByteArray,_QPalette>_> **)this;
    local_38.d = pQVar1;
    if ((pDVar2 == (Data<QHashPrivate::Node<QByteArray,_QPalette>_> *)0x0) ||
       (1 < (uint)(pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
      pDVar2 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QPalette>_>::detached(pDVar2);
      *(Data<QHashPrivate::Node<QByteArray,_QPalette>_> **)this = pDVar2;
    }
    pVar3 = (piter)emplace_helper<QPalette_const&>(this,key,args);
    QHash<QByteArray,_QPalette>::~QHash((QHash<QByteArray,_QPalette> *)&local_38);
  }
  else {
    if (1 < *(uint *)&pQVar1->field_0x0) {
      if ((pQVar1 != (QPalettePrivate *)0x0) && (*(int *)&pQVar1->field_0x0 != -1)) {
        LOCK();
        *(int *)&pQVar1->field_0x0 = *(int *)&pQVar1->field_0x0 + 1;
        UNLOCK();
      }
      goto LAB_002c43cc;
    }
    if (*(ulong *)(pQVar1 + 8) < *(ulong *)(pQVar1 + 0x10) >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        pVar3 = (piter)emplace_helper<QPalette_const&>(this,key,args);
        return (iterator)pVar3;
      }
      goto LAB_002c444d;
    }
    QPalette::QPalette(&local_38,args);
    pVar3 = (piter)QHash<QByteArray,_QPalette>::emplace_helper<QPalette>
                             ((QHash<QByteArray,_QPalette> *)this,key,&local_38);
    QPalette::~QPalette(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (iterator)pVar3;
  }
LAB_002c444d:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }